

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O3

int Int_ManProofTraceOne(Int_Man_t *p,Sto_Cls_t *pConflict,Sto_Cls_t *pFinal)

{
  int iVar1;
  lit lVar2;
  uint *puVar3;
  Sto_Cls_t *pSVar4;
  int *piVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  lit *plVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  timespec ts;
  uint local_64;
  timespec local_48;
  long local_38;
  
  iVar7 = clock_gettime(3,&local_48);
  if (iVar7 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (p->fProofVerif != 0) {
    uVar12 = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
    if (p->nResLitsAlloc < (int)uVar12) {
      __assert_fail("(int)pConflict->nLits <= p->nResLitsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                    ,599,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
    }
    memcpy(p->pResLits,pConflict + 1,(ulong)(uVar12 << 2));
    p->nResLits = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
  }
  if ((*(uint *)&pConflict->field_0x1c & 0x7fffff8) != 0) {
    uVar9 = 0;
    do {
      p->pSeens[*(int *)((long)&pConflict[1].pNext + uVar9 * 4) >> 1] = '\x01';
      uVar9 = uVar9 + 1;
    } while (uVar9 < (*(uint *)&pConflict->field_0x1c >> 3 & 0xffffff));
  }
  if (p->pCnf->nClausesA != 0) {
    iVar7 = p->nWords;
    if (0 < (long)iVar7) {
      puVar3 = p->pInters;
      iVar15 = pFinal->Id;
      iVar1 = pConflict->Id;
      uVar9 = (long)iVar7 + 1;
      do {
        puVar3[(long)(iVar15 * iVar7) + (uVar9 - 2)] = puVar3[(long)(iVar1 * iVar7) + (uVar9 - 2)];
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
    }
  }
  local_38 = lVar14;
  if (0 < (long)p->nTrailSize) {
    uVar9 = (ulong)(uint)p->pProofNums[pConflict->Id];
    lVar14 = (long)p->nTrailSize;
    do {
      uVar12 = p->pTrail[lVar14 + -1] >> 1;
      if (p->pSeens[(int)uVar12] != '\0') {
        p->pSeens[(int)uVar12] = '\0';
        pSVar4 = p->pReasons[(int)uVar12];
        if (pSVar4 != (Sto_Cls_t *)0x0) {
          if (p->pTrail[lVar14 + -1] != *(int *)&pSVar4[1].pNext) {
            __assert_fail("p->pTrail[i] == pReason->pLits[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                          ,0x275,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
          }
          if ((*(uint *)&pSVar4->field_0x1c & 0x7fffff0) != 0) {
            lVar16 = 9;
            do {
              p->pSeens[*(int *)((long)&pSVar4->pNext + lVar16 * 4) >> 1] = '\x01';
              uVar10 = lVar16 - 7;
              lVar16 = lVar16 + 1;
            } while (uVar10 < (*(uint *)&pSVar4->field_0x1c >> 3 & 0xffffff));
          }
          if (p->pProofNums[pSVar4->Id] < 1) {
            __assert_fail("Int_ManProofGet(p, pReason) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                          ,0x27d,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
          }
          local_64 = p->Counter + 1;
          p->Counter = local_64;
          if (p->fProofWrite != 0) {
            fprintf((FILE *)p->pFile,"%d * %d %d 0\n",(ulong)local_64,uVar9);
            local_64 = p->Counter;
          }
          if (p->pCnf->nClausesA != 0) {
            puVar3 = p->pInters;
            uVar8 = p->nWords;
            iVar7 = pFinal->Id * uVar8;
            iVar15 = pSVar4->Id * uVar8;
            if (p->pVarTypes[(int)uVar12] == 1) {
              if (0 < (int)uVar8) {
                uVar9 = (ulong)uVar8 + 1;
                do {
                  puVar3[(long)iVar7 + (uVar9 - 2)] =
                       puVar3[(long)iVar7 + (uVar9 - 2)] | puVar3[(long)iVar15 + (uVar9 - 2)];
                  uVar9 = uVar9 - 1;
                } while (1 < uVar9);
              }
            }
            else if (0 < (int)uVar8) {
              uVar9 = (ulong)uVar8 + 1;
              do {
                puVar3[(long)iVar7 + (uVar9 - 2)] =
                     puVar3[(long)iVar7 + (uVar9 - 2)] & puVar3[(long)iVar15 + (uVar9 - 2)];
                uVar9 = uVar9 - 1;
              } while (1 < uVar9);
            }
          }
          if (p->fProofVerif != 0) {
            uVar8 = p->nResLits;
            if ((int)uVar8 < 1) {
              uVar9 = 0;
LAB_00551def:
              if ((uint)uVar9 == uVar8) goto LAB_00551df4;
            }
            else {
              uVar9 = 0;
              do {
                if (p->pResLits[uVar9] >> 1 == uVar12) goto LAB_00551def;
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
              uVar9 = (ulong)uVar8;
LAB_00551df4:
              printf("Recording clause %d: Cannot find variable %d in the temporary resolvent.\n",
                     (ulong)(uint)pFinal->Id,(ulong)uVar12);
            }
            plVar11 = p->pResLits;
            uVar10 = uVar9 & 0xffffffff;
            uVar8 = plVar11[uVar10];
            if ((*(uint *)&pSVar4[1].pNext ^ uVar8) != 1) {
              printf("Recording clause %d: The resolved variable %d is in the wrong polarity.\n",
                     (ulong)(uint)pFinal->Id,(ulong)uVar12);
              plVar11 = p->pResLits;
              uVar8 = plVar11[uVar10];
            }
            if ((int)uVar8 >> 1 != uVar12) {
              __assert_fail("lit_var(p->pResLits[v1]) == Var",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                            ,0x29a,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)"
                           );
            }
            iVar7 = p->nResLits + -1;
            p->nResLits = iVar7;
            if ((int)uVar9 < iVar7) {
              plVar11 = plVar11 + uVar10;
              do {
                *plVar11 = plVar11[1];
                uVar12 = (int)uVar9 + 1;
                uVar9 = (ulong)uVar12;
                plVar11 = plVar11 + 1;
              } while ((int)uVar12 < p->nResLits);
            }
            if ((*(uint *)&pSVar4->field_0x1c & 0x7fffff0) == 0) {
              uVar9 = (ulong)local_64;
              goto LAB_00551f67;
            }
            uVar9 = 1;
            do {
              iVar7 = p->nResLits;
              if ((long)iVar7 < 1) {
                uVar10 = 0;
LAB_00551ecf:
                if ((int)uVar10 == iVar7) goto LAB_00551ed3;
                if (p->pResLits[uVar10 & 0xffffffff] != *(int *)((long)&pSVar4[1].pNext + uVar9 * 4)
                   ) {
                  printf("Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n"
                         ,(ulong)(uint)pFinal->Id);
                }
              }
              else {
                uVar10 = 0;
                do {
                  if ((p->pResLits[uVar10] ^ *(uint *)((long)&pSVar4[1].pNext + uVar9 * 4)) < 2)
                  goto LAB_00551ecf;
                  uVar10 = uVar10 + 1;
                } while ((long)iVar7 != uVar10);
LAB_00551ed3:
                if (iVar7 == p->nResLitsAlloc) {
                  printf("Recording clause %d: Ran out of space for intermediate resolvent.\n",
                         (ulong)(uint)pFinal->Id);
                  iVar7 = p->nResLits;
                }
                lVar2 = *(lit *)((long)&pSVar4[1].pNext + uVar9 * 4);
                p->nResLits = iVar7 + 1;
                p->pResLits[iVar7] = lVar2;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < (*(uint *)&pSVar4->field_0x1c >> 3 & 0xffffff));
          }
          uVar9 = (ulong)local_64;
        }
      }
LAB_00551f67:
      bVar6 = 1 < lVar14;
      lVar14 = lVar14 + -1;
    } while (bVar6);
  }
  lVar14 = local_38;
  if (p->fProofVerif != 0) {
    uVar12 = p->nResLits;
    if (0 < (long)(int)uVar12) {
      uVar8 = *(uint *)&pFinal->field_0x1c >> 3 & 0xffffff;
      if (uVar8 == 0) {
LAB_00551fc4:
        printf("Recording clause %d: The final resolvent is wrong.\n",(ulong)(uint)pFinal->Id);
        Int_ManPrintClause(p,pConflict);
        Int_ManPrintResolvent(p->pResLits,p->nResLits);
        Int_ManPrintClause(p,pFinal);
        uVar12 = p->nResLits;
      }
      else {
        lVar16 = 0;
        do {
          uVar9 = 0;
          while (*(int *)((long)&pFinal[1].pNext + uVar9 * 4) != p->pResLits[lVar16]) {
            uVar9 = uVar9 + 1;
            if (uVar8 == uVar9) goto LAB_00551fc4;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != (int)uVar12);
      }
    }
    uVar8 = *(uint *)&pFinal->field_0x1c;
    uVar13 = uVar8 >> 3 & 0xffffff;
    if (uVar12 != uVar13) {
      if (uVar13 == 0) {
        uVar13 = 0;
      }
      else {
        iVar7 = 0;
        do {
          if (0 < (long)p->nResLits) {
            lVar16 = 0;
            do {
              if (*(int *)((long)&pFinal[1].pNext + (long)iVar7 * 4) == p->pResLits[lVar16]) {
                iVar7 = iVar7 + 1;
                goto LAB_0055209f;
              }
              lVar16 = lVar16 + 1;
            } while (p->nResLits != lVar16);
          }
          uVar12 = uVar8 + 0x7fffff8;
          uVar8 = uVar8 & 0xf8000007 | uVar12 & 0x7fffff8;
          *(uint *)&pFinal->field_0x1c = uVar8;
          if (iVar7 < (int)(uVar12 >> 3 & 0xffffff)) {
            lVar16 = (long)iVar7;
            do {
              *(undefined4 *)((long)&pFinal[1].pNext + lVar16 * 4) =
                   *(undefined4 *)((long)&pFinal[1].pNext + lVar16 * 4 + 4);
              lVar16 = lVar16 + 1;
              uVar8 = *(uint *)&pFinal->field_0x1c;
            } while (lVar16 < (long)(ulong)(uVar8 >> 3 & 0xffffff));
          }
LAB_0055209f:
          uVar13 = uVar8 >> 3 & 0xffffff;
        } while (iVar7 < (int)uVar13);
        uVar12 = p->nResLits;
      }
      if (uVar12 != uVar13) {
        __assert_fail("p->nResLits == (int)pFinal->nLits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                      ,0x2e7,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
      }
    }
  }
  iVar7 = clock_gettime(3,&local_48);
  if (iVar7 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeTrace = p->timeTrace + lVar16 + lVar14;
  iVar7 = p->Counter;
  piVar5 = p->pProofNums;
  piVar5[pFinal->Id] = iVar7;
  if (piVar5[(long)pFinal->Id + -1] == iVar7) {
    __assert_fail("p->pProofNums[pFinal->Id-1] != p->Counter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                  ,0x2f3,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  return iVar7;
}

Assistant:

int Int_ManProofTraceOne( Int_Man_t * p, Sto_Cls_t * pConflict, Sto_Cls_t * pFinal )
{
    Sto_Cls_t * pReason;
    int i, v, Var, PrevId;
    int fPrint = 0;
    abctime clk = Abc_Clock();

    // collect resolvent literals
    if ( p->fProofVerif )
    {
        assert( (int)pConflict->nLits <= p->nResLitsAlloc );
        memcpy( p->pResLits, pConflict->pLits, sizeof(lit) * pConflict->nLits );
        p->nResLits = pConflict->nLits;
    }

    // mark all the variables in the conflict as seen
    for ( v = 0; v < (int)pConflict->nLits; v++ )
        p->pSeens[lit_var(pConflict->pLits[v])] = 1;

    // start the anticedents
//    pFinal->pAntis = Vec_PtrAlloc( 32 );
//    Vec_PtrPush( pFinal->pAntis, pConflict );

    if ( p->pCnf->nClausesA )
        Int_ManTruthCopy( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pConflict), p->nWords );

    // follow the trail backwards
    PrevId = Int_ManProofGet(p, pConflict);
    for ( i = p->nTrailSize - 1; i >= 0; i-- )
    {
        // skip literals that are not involved
        Var = lit_var(p->pTrail[i]);
        if ( !p->pSeens[Var] )
            continue;
        p->pSeens[Var] = 0;

        // skip literals of the resulting clause
        pReason = p->pReasons[Var];
        if ( pReason == NULL )
            continue;
        assert( p->pTrail[i] == pReason->pLits[0] );

        // add the variables to seen
        for ( v = 1; v < (int)pReason->nLits; v++ )
            p->pSeens[lit_var(pReason->pLits[v])] = 1;


        // record the reason clause
        assert( Int_ManProofGet(p, pReason) > 0 );
        p->Counter++;
        if ( p->fProofWrite )
            fprintf( p->pFile, "%d * %d %d 0\n", p->Counter, PrevId, Int_ManProofGet(p, pReason) );
        PrevId = p->Counter;

        if ( p->pCnf->nClausesA )
        {
            if ( p->pVarTypes[Var] == 1 ) // var of A
                Int_ManTruthOr( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pReason), p->nWords );
            else
                Int_ManTruthAnd( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pReason), p->nWords );
        }
 
        // resolve the temporary resolvent with the reason clause
        if ( p->fProofVerif )
        {
            int v1, v2; 
            if ( fPrint )
                Int_ManPrintResolvent( p->pResLits, p->nResLits );
            // check that the var is present in the resolvent
            for ( v1 = 0; v1 < p->nResLits; v1++ )
                if ( lit_var(p->pResLits[v1]) == Var )
                    break;
            if ( v1 == p->nResLits )
                printf( "Recording clause %d: Cannot find variable %d in the temporary resolvent.\n", pFinal->Id, Var );
            if ( p->pResLits[v1] != lit_neg(pReason->pLits[0]) )
                printf( "Recording clause %d: The resolved variable %d is in the wrong polarity.\n", pFinal->Id, Var );
            // remove this variable from the resolvent
            assert( lit_var(p->pResLits[v1]) == Var );
            p->nResLits--;
            for ( ; v1 < p->nResLits; v1++ )
                p->pResLits[v1] = p->pResLits[v1+1];
            // add variables of the reason clause
            for ( v2 = 1; v2 < (int)pReason->nLits; v2++ )
            {
                for ( v1 = 0; v1 < p->nResLits; v1++ )
                    if ( lit_var(p->pResLits[v1]) == lit_var(pReason->pLits[v2]) )
                        break;
                // if it is a new variable, add it to the resolvent
                if ( v1 == p->nResLits ) 
                {
                    if ( p->nResLits == p->nResLitsAlloc )
                        printf( "Recording clause %d: Ran out of space for intermediate resolvent.\n", pFinal->Id );
                    p->pResLits[ p->nResLits++ ] = pReason->pLits[v2];
                    continue;
                }
                // if the variable is the same, the literal should be the same too
                if ( p->pResLits[v1] == pReason->pLits[v2] )
                    continue;
                // the literal is different
                printf( "Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n", pFinal->Id );
            }
        }

//        Vec_PtrPush( pFinal->pAntis, pReason );
    }

    // unmark all seen variables
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        p->pSeens[lit_var(p->pTrail[i])] = 0;
    // check that the literals are unmarked
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        assert( p->pSeens[lit_var(p->pTrail[i])] == 0 );

    // use the resulting clause to check the correctness of resolution
    if ( p->fProofVerif )
    {
        int v1, v2; 
        if ( fPrint )
            Int_ManPrintResolvent( p->pResLits, p->nResLits );
        for ( v1 = 0; v1 < p->nResLits; v1++ )
        {
            for ( v2 = 0; v2 < (int)pFinal->nLits; v2++ )
                if ( pFinal->pLits[v2] == p->pResLits[v1] )
                    break;
            if ( v2 < (int)pFinal->nLits )
                continue;
            break;
        }
        if ( v1 < p->nResLits )
        {
            printf( "Recording clause %d: The final resolvent is wrong.\n", pFinal->Id );
            Int_ManPrintClause( p, pConflict );
            Int_ManPrintResolvent( p->pResLits, p->nResLits );
            Int_ManPrintClause( p, pFinal );
        }

        // if there are literals in the clause that are not in the resolvent
        // it means that the derived resolvent is stronger than the clause
        // we can replace the clause with the resolvent by removing these literals
        if ( p->nResLits != (int)pFinal->nLits )
        {
            for ( v1 = 0; v1 < (int)pFinal->nLits; v1++ )
            {
                for ( v2 = 0; v2 < p->nResLits; v2++ )
                    if ( pFinal->pLits[v1] == p->pResLits[v2] )
                        break;
                if ( v2 < p->nResLits )
                    continue;
                // remove literal v1 from the final clause
                pFinal->nLits--;
                for ( v2 = v1; v2 < (int)pFinal->nLits; v2++ )
                    pFinal->pLits[v2] = pFinal->pLits[v2+1];
                v1--;
            }
            assert( p->nResLits == (int)pFinal->nLits );
        }
    }
p->timeTrace += Abc_Clock() - clk;

    // return the proof pointer 
    if ( p->pCnf->nClausesA )
    {
//        Int_ManPrintInterOne( p, pFinal );
    }
    Int_ManProofSet( p, pFinal, p->Counter );
    // make sure the same proof ID is not asssigned to two consecutive clauses
    assert( p->pProofNums[pFinal->Id-1] != p->Counter );
    return p->Counter;
}